

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query.c
# Opt level: O2

_Bool ecs_query_next(ecs_iter_t *it)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ecs_query_t *peVar5;
  ecs_table_t *peVar6;
  ecs_vector_t *vector;
  ecs_table_t *vector_00;
  uint64_t *puVar7;
  ecs_switch_t *sw;
  long lVar8;
  int32_t iVar9;
  void *pvVar10;
  void *pvVar11;
  ecs_data_t *peVar12;
  void *pvVar13;
  ecs_bs_column_t *peVar14;
  long lVar15;
  ecs_data_t *peVar16;
  ecs_sw_column_t *peVar17;
  uint64_t uVar18;
  int *piVar19;
  ulong *puVar20;
  ecs_iter_table_t *peVar21;
  undefined8 *puVar22;
  uint uVar23;
  int iVar24;
  ulong uVar25;
  int iVar26;
  int iVar27;
  uint uVar28;
  long lVar29;
  int iVar30;
  int iVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  bool bVar35;
  uint local_d0;
  int local_cc;
  int local_98;
  uint local_94;
  long local_78;
  ecs_world_t *world;
  
  _ecs_assert(it != (ecs_iter_t *)0x0,2,(char *)0x0,"it != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/query.c"
              ,0xae8);
  if (it == (ecs_iter_t *)0x0) {
    __assert_fail("it != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/query.c"
                  ,0xae8,"_Bool ecs_query_next(ecs_iter_t *)");
  }
  world = it->world;
  peVar5 = it->query;
  ecs_get_stage(&world);
  pvVar10 = _ecs_vector_first(peVar5->table_slices,0x10,0x10);
  pvVar11 = _ecs_vector_first(peVar5->tables,0x50,0x10);
  if (pvVar10 == (void *)0x0) {
    _ecs_assert(true,0xc,(char *)0x0,"!slice || query->compare",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/query.c"
                ,0xaf4);
  }
  else {
    _ecs_assert(peVar5->compare != (ecs_compare_action_t)0x0,0xc,(char *)0x0,
                "!slice || query->compare",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/query.c"
                ,0xaf4);
    if (peVar5->compare == (ecs_compare_action_t)0x0) {
      __assert_fail("!slice || query->compare",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/query.c"
                    ,0xaf4,"_Bool ecs_query_next(ecs_iter_t *)");
    }
  }
  iVar2 = it->table_count;
  iVar3 = it->total_count;
  lVar1 = (long)(it->iter).query.index;
LAB_00118e47:
  do {
    do {
      local_78 = lVar1;
      if (iVar2 <= local_78) {
        return false;
      }
      if (pvVar10 == (void *)0x0) {
        peVar21 = (ecs_iter_table_t *)(local_78 * 0x50 + (long)pvVar11);
      }
      else {
        peVar21 = *(ecs_iter_table_t **)((long)pvVar10 + local_78 * 0x10);
      }
      peVar6 = peVar21->table;
      lVar1 = local_78 + 1;
      (it->iter).query.index = (int32_t)lVar1;
      if (peVar6 == (ecs_table_t *)0x0) goto LAB_0011952e;
      vector = (ecs_vector_t *)peVar21[1].columns;
      vector_00 = peVar21[1].table;
      peVar12 = ecs_table_get_data(peVar6);
      _ecs_assert(peVar12 != (ecs_data_t *)0x0,0xc,(char *)0x0,"data != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/query.c"
                  ,0xb06);
      if (peVar12 == (ecs_data_t *)0x0) {
        __assert_fail("data != ((void*)0)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/query.c"
                      ,0xb06,"_Bool ecs_query_next(ecs_iter_t *)");
      }
      it->table_columns = peVar12->columns;
      if (pvVar10 == (void *)0x0) {
        local_98 = ecs_table_count(peVar6);
        local_94 = 0;
      }
      else {
        local_94 = *(uint *)((long)pvVar10 + local_78 * 0x10 + 8);
        local_98 = *(int *)((long)pvVar10 + local_78 * 0x10 + 0xc);
      }
    } while (local_98 == 0);
    if (vector_00 != (ecs_table_t *)0x0) {
      iVar9 = ecs_vector_count((ecs_vector_t *)vector_00);
      pvVar13 = _ecs_vector_first((ecs_vector_t *)vector_00,0x10,0x10);
      iVar26 = peVar6->bs_column_offset;
      uVar28 = (it->iter).query.bitset_first;
      local_d0 = 0;
      iVar27 = 0;
LAB_00118f84:
      iVar24 = iVar27;
      if (iVar24 < iVar9) {
        peVar14 = *(ecs_bs_column_t **)((long)pvVar13 + (long)iVar24 * 0x10);
        if (peVar14 == (ecs_bs_column_t *)0x0) {
          puVar22 = (undefined8 *)((long)iVar24 * 0x10 + (long)pvVar13);
          peVar16 = peVar6->data;
          iVar27 = *(int *)(puVar22 + 1);
          _ecs_assert(-1 < iVar27 - iVar26,0xc,(char *)0x0,"(index - bs_offset >= 0)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/query.c"
                      ,0xa5a);
          uVar23 = iVar27 - iVar26;
          if ((int)uVar23 < 0) {
            __assert_fail("(index - bs_offset >= 0)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/query.c"
                          ,0xa5a,
                          "int bitset_column_next(ecs_table_t *, ecs_vector_t *, ecs_query_iter_t *, ecs_page_cursor_t *)"
                         );
          }
          peVar14 = peVar16->bs_columns + uVar23;
          *puVar22 = peVar14;
        }
        iVar31 = (peVar14->data).count;
        iVar27 = iVar31 + -1 >> 6;
        if ((int)uVar28 >> 6 <= iVar27) {
          puVar7 = (peVar14->data).data;
          uVar33 = (ulong)(uVar28 & 0x3f);
          uVar34 = *(ulong *)(bitset_column_next_bitmask_remain + uVar33 * 8);
          for (lVar29 = (long)((int)uVar28 >> 6); uVar25 = puVar7[lVar29], (uVar25 & uVar34) == 0;
              lVar29 = lVar29 + 1) {
            if (iVar27 <= lVar29) goto LAB_00118e47;
            uVar33 = 0;
            uVar34 = 0xffffffffffffffff;
          }
          while (((&bitset_column_next_bitmask)[uVar33] & uVar25) == 0) {
            uVar34 = uVar33 + 1;
            _ecs_assert(uVar33 < 0x3f,0xc,(char *)0x0,"bs_start < 64",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/query.c"
                        ,0xa7f);
            uVar33 = uVar34;
            if (uVar34 == 0x40) {
              __assert_fail("bs_start < 64",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/query.c"
                            ,0xa7f,
                            "int bitset_column_next(ecs_table_t *, ecs_vector_t *, ecs_query_iter_t *, ecs_page_cursor_t *)"
                           );
            }
          }
          uVar32 = uVar33 & 0xffffffff;
          lVar15 = lVar29;
          uVar34 = *(ulong *)(bitset_column_next_bitmask_remain + uVar33 * 8);
          while (iVar30 = (int)uVar32, local_cc = iVar27 + 1, (uVar34 & ~uVar25) == 0) {
            if (iVar27 == lVar15) {
              iVar30 = 0;
              goto LAB_0011912e;
            }
            lVar8 = lVar15 + 1;
            lVar15 = lVar15 + 1;
            uVar32 = 0;
            uVar34 = 0xffffffffffffffff;
            uVar25 = puVar7[lVar8];
          }
          if (iVar27 + 1 != (int)lVar15) {
            iVar30 = iVar30 + -1;
            puVar20 = &bitset_column_next_bitmask + uVar32;
            do {
              iVar30 = iVar30 + 1;
              uVar34 = *puVar20;
              puVar20 = puVar20 + 1;
              local_cc = (int)lVar15;
            } while ((uVar34 & uVar25) != 0);
          }
LAB_0011912e:
          _ecs_assert(iVar30 < 0x40,0xc,(char *)0x0,"bs_end < 64",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/query.c"
                      ,0xa9a);
          if (0x3f < iVar30) {
            __assert_fail("bs_end < 64",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/query.c"
                          ,0xa9a,
                          "int bitset_column_next(ecs_table_t *, ecs_vector_t *, ecs_query_iter_t *, ecs_page_cursor_t *)"
                         );
          }
          uVar28 = (int)lVar29 * 0x40 + (int)uVar33;
          uVar23 = iVar30 + local_cc * 0x40;
          if (uVar28 != uVar23) {
            if (iVar24 != 0) break;
            goto LAB_001191aa;
          }
        }
        goto LAB_00118e47;
      }
      (it->iter).query.bitset_first = local_d0;
      (it->iter).query.index = (int32_t)local_78;
    }
    if (vector != (ecs_vector_t *)0x0) {
      iVar26 = (it->iter).query.sparse_smallest;
      iVar27 = iVar26;
      if (iVar26 == 0) {
        pvVar13 = _ecs_vector_first(vector,0x18,0x10);
        uVar28 = ecs_vector_count(vector);
        uVar33 = 0;
        uVar34 = (ulong)uVar28;
        if ((int)uVar28 < 1) {
          uVar34 = uVar33;
        }
        iVar31 = 0x7fffffff;
        iVar24 = 1;
        iVar27 = 0;
        for (; uVar34 * 0x18 != uVar33; uVar33 = uVar33 + 0x18) {
          peVar17 = *(ecs_sw_column_t **)((long)pvVar13 + uVar33);
          if (peVar17 == (ecs_sw_column_t *)0x0) {
            iVar30 = peVar21->columns[*(int *)((long)pvVar13 + uVar33 + 0x10)];
            iVar4 = peVar6->sw_column_offset;
            _ecs_assert(0 < iVar30 - iVar4,0xc,(char *)0x0,"table_column_index >= 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/query.c"
                        ,0x9b9);
            if (iVar30 - iVar4 == 0 || iVar30 < iVar4) {
              __assert_fail("table_column_index >= 1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/query.c"
                            ,0x9b9,
                            "int find_smallest_column(ecs_table_t *, ecs_matched_table_t *, ecs_vector_t *)"
                           );
            }
            peVar16 = ecs_table_get_data(peVar6);
            peVar17 = peVar16->sw_columns + ((ulong)(uint)(iVar30 - iVar4) - 1);
            *(ecs_sw_column_t **)((long)pvVar13 + uVar33) = peVar17;
          }
          iVar9 = ecs_switch_case_count(peVar17->data,*(uint64_t *)((long)pvVar13 + uVar33 + 8));
          if (iVar9 < iVar31) {
            iVar31 = iVar9;
            iVar27 = iVar24;
          }
          iVar24 = iVar24 + 1;
        }
        (it->iter).query.sparse_smallest = iVar27;
      }
      pvVar13 = _ecs_vector_first(vector,0x18,0x10);
      lVar29 = (long)(int)(iVar27 - 1U) * 0x18;
      sw = (ecs_switch_t *)**(undefined8 **)((long)pvVar13 + lVar29);
      if (iVar26 == 0) {
        local_94 = ecs_switch_first(sw,*(uint64_t *)((long)pvVar13 + lVar29 + 8));
      }
      else {
        local_94 = ecs_switch_next(sw,(it->iter).query.sparse_first);
      }
      if (local_94 == 0xffffffff) {
LAB_0011945a:
        *(ecs_match_kind_t *)((long)&it->iter + 0x10) = EcsMatchDefault;
        *(ecs_match_kind_t *)((long)&it->iter + 0x14) = EcsMatchDefault;
        goto LAB_00118e47;
      }
      uVar28 = ecs_vector_count(vector);
      uVar34 = 0;
      if (0 < (int)uVar28) {
        uVar34 = (ulong)uVar28;
      }
      uVar33 = 0;
      do {
        for (; uVar33 != uVar34; uVar33 = uVar33 + 1) {
          if (((uVar33 != iVar27 - 1U) &&
              (uVar18 = ecs_switch_get((ecs_switch_t *)
                                       **(undefined8 **)((long)pvVar13 + uVar33 * 0x18),local_94),
              uVar18 != *(uint64_t *)((long)pvVar13 + uVar33 * 0x18 + 8))) &&
             (local_94 = ecs_switch_next(sw,local_94), local_94 == 0xffffffff)) goto LAB_0011945a;
        }
        uVar33 = 0;
      } while ((int)uVar28 < 0);
      (it->iter).query.sparse_first = local_94;
      (it->iter).query.index = (int32_t)local_78;
      local_98 = 1;
    }
    iVar26 = (it->iter).query.page_iter.offset;
    iVar27 = (it->iter).query.page_iter.limit;
    iVar24 = local_98;
    if (iVar26 != 0 || iVar27 != 0) {
      iVar31 = (it->iter).query.page_iter.remaining;
      if (iVar26 != 0) {
        if (iVar26 - local_98 != 0 && local_98 <= iVar26) {
          (it->iter).query.page_iter.offset = iVar26 - local_98;
          goto LAB_00118e47;
        }
        local_94 = local_94 + iVar26;
        local_98 = local_98 - iVar26;
        (it->iter).query.page_iter.offset = 0;
      }
      if (iVar31 == 0) {
        iVar24 = local_98;
        if (iVar27 != 0) {
          return false;
        }
      }
      else {
        iVar26 = iVar31 - local_98;
        bVar35 = iVar26 == 0;
        iVar24 = iVar31;
        if (local_98 <= iVar31) {
          iVar24 = local_98;
        }
        if (bVar35 || iVar31 < local_98) {
          iVar26 = 0;
        }
        (it->iter).query.page_iter.remaining = iVar26;
        if (bVar35 || iVar31 < local_98) goto LAB_001194f2;
      }
    }
    if (local_98 != 0) {
LAB_001194f2:
      pvVar10 = _ecs_vector_first(peVar12->entities,8,0x10);
      it->entities = (ecs_entity_t *)((long)pvVar10 + (long)(int)local_94 * 8);
      it->offset = local_94;
      it->count = iVar24;
      it->total_count = iVar24;
LAB_0011952e:
      it->table = peVar21;
      it->frame_offset = it->frame_offset + iVar3;
      if (((peVar6 != (ecs_table_t *)0x0) && ((peVar5->flags & 0x400) != 0)) &&
         ((peVar6 = peVar21->table, peVar6 != (ecs_table_t *)0x0 &&
          (peVar6->dirty_state != (int32_t *)0x0)))) {
        uVar28 = ecs_vector_count((peVar5->sig).columns);
        pvVar10 = _ecs_vector_first((peVar5->sig).columns,0x28,0x10);
        uVar33 = 0;
        uVar34 = (ulong)uVar28;
        if ((int)uVar28 < 1) {
          uVar34 = uVar33;
        }
        piVar19 = (int *)((long)pvVar10 + 8);
        for (; uVar34 != uVar33; uVar33 = uVar33 + 1) {
          if ((*piVar19 != 1) && (0 < (long)peVar21->columns[uVar33])) {
            peVar6->dirty_state[peVar21->columns[uVar33]] =
                 peVar6->dirty_state[peVar21->columns[uVar33]] + 1;
          }
          piVar19 = piVar19 + 10;
        }
      }
      return true;
    }
  } while( true );
  iVar27 = 0;
  if ((int)uVar28 < (int)local_d0) {
    if ((int)local_d0 <= (int)uVar23) {
      uVar23 = local_d0;
    }
LAB_001191aa:
    local_98 = uVar23 - uVar28;
    if (iVar31 <= (int)(uVar23 - uVar28)) {
      local_98 = iVar31;
    }
    (it->iter).query.bitset_first = uVar28;
    iVar27 = iVar24 + 1;
    local_d0 = uVar23;
    local_94 = uVar28;
  }
  goto LAB_00118f84;
}

Assistant:

bool ecs_query_next(
    ecs_iter_t *it)
{
    ecs_assert(it != NULL, ECS_INVALID_PARAMETER, NULL);
    ecs_query_iter_t *iter = &it->iter.query;
    ecs_page_iter_t *piter = &iter->page_iter;
    ecs_world_t *world = it->world;
    ecs_query_t *query = it->query;

    ecs_get_stage(&world);
    ecs_table_slice_t *slice = ecs_vector_first(
        query->table_slices, ecs_table_slice_t);
    ecs_matched_table_t *tables = ecs_vector_first(
        query->tables, ecs_matched_table_t);

    ecs_assert(!slice || query->compare, ECS_INTERNAL_ERROR, NULL);
    
    ecs_page_cursor_t cur;
    int32_t table_count = it->table_count;
    int32_t prev_count = it->total_count;

    int i;
    for (i = iter->index; i < table_count; i ++) {
        ecs_matched_table_t *table_data = slice ? slice[i].table : &tables[i];
        ecs_table_t *table = table_data->iter_data.table;
        ecs_data_t *data = NULL;

        iter->index = i + 1;
        
        if (table) {
            ecs_vector_t *bitset_columns = table_data->bitset_columns;
            ecs_vector_t *sparse_columns = table_data->sparse_columns;
            data = ecs_table_get_data(table);
            ecs_assert(data != NULL, ECS_INTERNAL_ERROR, NULL);
            it->table_columns = data->columns;
            
            if (slice) {
                cur.first = slice[i].start_row;
                cur.count = slice[i].count;                
            } else {
                cur.first = 0;
                cur.count = ecs_table_count(table);
            }

            if (cur.count) {
                if (bitset_columns) {
            
                    if (bitset_column_next(table, bitset_columns, iter, 
                        &cur) == -1) 
                    {
                        /* No more enabled components for table */
                        continue; 
                    } else {
                        iter->index = i;
                    }
                }

                if (sparse_columns) {
                    if (sparse_column_next(table, table_data,
                        sparse_columns, iter, &cur) == -1)
                    {
                        /* No more elements in sparse column */
                        continue;    
                    } else {
                        iter->index = i;
                    }
                }

                int ret = ecs_page_iter_next(piter, &cur);
                if (ret < 0) {
                    return false;
                } else if (ret > 0) {
                    continue;
                }
            } else {
                continue;
            }

            ecs_entity_t *entity_buffer = ecs_vector_first(
                data->entities, ecs_entity_t); 
            it->entities = &entity_buffer[cur.first];
            it->offset = cur.first;
            it->count = cur.count;
            it->total_count = cur.count;
        }

        it->table = &table_data->iter_data;
        it->frame_offset += prev_count;

        if (query->flags & EcsQueryHasOutColumns) {
            if (table) {
                mark_columns_dirty(query, table_data);
            }
        }

        return true;
    }

    return false;
}